

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.c
# Opt level: O1

int ly_write(lyout *out,char *buf,size_t count)

{
  void **ppvVar1;
  FILE *pFVar2;
  LY_ERR *pLVar3;
  size_t size;
  
  switch(out->type) {
  case LYOUT_FD:
    count = write((out->method).fd,buf,count);
    break;
  case LYOUT_STREAM:
    count = fwrite(buf,1,count,(FILE *)(out->method).f);
    break;
  case LYOUT_MEMORY:
    size = (long)(out->method).clb.arg + count + 1;
    if ((out->method).mem.size < size) {
      pFVar2 = (FILE *)ly_realloc((out->method).f,size);
      if (pFVar2 == (FILE *)0x0) {
        (out->method).f = (FILE *)0x0;
        (out->method).mem.len = 0;
        (out->method).mem.size = 0;
        pLVar3 = ly_errno_location();
        *pLVar3 = LY_EMEM;
        ly_log(LY_LLERR,"Memory allocation failed (%s()).","ly_write");
        count = 0xffffffff;
        break;
      }
      (out->method).f = pFVar2;
      (out->method).mem.size = (long)(out->method).clb.arg + count + 1;
    }
    memcpy((void *)((long)&((out->method).f)->_flags + (long)(out->method).clb.arg),buf,count + 1);
    ppvVar1 = &(out->method).clb.arg;
    *ppvVar1 = (void *)((long)*ppvVar1 + count);
    break;
  case LYOUT_CALLBACK:
    count = (*(out->method).clb.f)((void *)(out->method).mem.len,buf,count);
    break;
  default:
    count = 0;
  }
  return (int)count;
}

Assistant:

int
ly_write(struct lyout *out, const char *buf, size_t count)
{
    char *aux;

    switch(out->type) {
    case LYOUT_FD:
        return write(out->method.fd, buf, count);
    case LYOUT_STREAM:
        return fwrite(buf, sizeof *buf, count, out->method.f);
    case LYOUT_MEMORY:
        if (out->method.mem.len + count + 1 > out->method.mem.size) {
            aux = ly_realloc(out->method.mem.buf, out->method.mem.len + count + 1);
            if (!aux) {
                out->method.mem.buf = NULL;
                out->method.mem.len = 0;
                out->method.mem.size = 0;
                LOGMEM;
                return -1;
            }
            out->method.mem.buf = aux;
            out->method.mem.size = out->method.mem.len + count + 1;
        }
        memcpy(&out->method.mem.buf[out->method.mem.len], buf, count + 1);
        out->method.mem.len += count;
        return count;
    case LYOUT_CALLBACK:
        return out->method.clb.f(out->method.clb.arg, buf, count);
    }

    return 0;
}